

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iRpn.cpp
# Opt level: O3

void __thiscall Imaginer::Utils::iRpn::~iRpn(iRpn *this)

{
  iStack<char> *piVar1;
  iStack<Imaginer::Utils::iRpn::RPNnode> *piVar2;
  
  piVar1 = this->_operator;
  if (piVar1 != (iStack<char> *)0x0) {
    if (piVar1->_data != (char *)0x0) {
      operator_delete__(piVar1->_data);
    }
    operator_delete(piVar1,0x10);
    this->_operator = (iStack<char> *)0x0;
  }
  piVar2 = this->_operands;
  if (piVar2 != (iStack<Imaginer::Utils::iRpn::RPNnode> *)0x0) {
    if (piVar2->_data != (RPNnode *)0x0) {
      operator_delete__(piVar2->_data);
    }
    operator_delete(piVar2,0x10);
    this->_operands = (iStack<Imaginer::Utils::iRpn::RPNnode> *)0x0;
  }
  return;
}

Assistant:

iRpn::~iRpn()
{
    //(_operator) ? (delete _operator,_operator = NULL) : (_operator);
    if(_operator)
    {
        delete _operator;
        _operator = NULL;
    }
    //(_operands) ? (delete _operands,_operands = NULL) : (_operands);
    if(_operands)
    {
        delete _operands;
        _operands = NULL;
    }
}